

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O1

void __thiscall flow::MatchInstr::MatchInstr(MatchInstr *this,MatchClass op,Value *cond)

{
  initializer_list<flow::Value_*> __l;
  allocator_type local_41;
  vector<flow::Value_*,_std::allocator<flow::Value_*>_> local_40;
  Value *local_28;
  undefined8 local_20;
  
  local_20 = 0;
  __l._M_len = 2;
  __l._M_array = &local_28;
  local_28 = cond;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector(&local_40,__l,&local_41);
  TerminateInstr::TerminateInstr(&this->super_TerminateInstr,&local_40);
  if (local_40.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_TerminateInstr).super_Instr.super_Value._vptr_Value =
       (_func_int **)&PTR__MatchInstr_00196268;
  this->op_ = op;
  (this->cases_).
  super__Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cases_).
  super__Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cases_).
  super__Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

MatchInstr::MatchInstr(MatchClass op, Value* cond)
    : TerminateInstr({cond, nullptr}), op_(op) {}